

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::Members::~Members(Members *this)

{
  Buffer *this_00;
  Members *this_local;
  
  if ((this->file != (FILE *)0x0) && ((this->close_file & 1U) != 0)) {
    fclose((FILE *)this->file);
  }
  this_00 = this->output_buffer;
  if (this_00 != (Buffer *)0x0) {
    Buffer::~Buffer(this_00);
    operator_delete(this_00,8);
  }
  std::shared_ptr<QPDFWriter::ProgressReporter>::~shared_ptr(&this->progress_reporter);
  std::__cxx11::string::~string((string *)&this->lin_pass1_filename);
  std::__cxx11::string::~string((string *)&this->deterministic_id_data);
  std::__cxx11::string::~string((string *)&this->count_buffer);
  std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::~vector(&this->pipeline_stack);
  std::
  map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~map(&this->object_stream_to_objects);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  ~map(&this->contents_to_page_seq);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  ~map(&this->page_object_to_seq);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
            (&this->normalized_streams);
  NewObjTable::~NewObjTable(&this->new_obj);
  ObjTable::~ObjTable(&this->obj);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->object_queue);
  std::__cxx11::list<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~list
            (&this->to_delete);
  std::__cxx11::string::~string((string *)&this->cur_data_key);
  std::__cxx11::string::~string((string *)&this->extra_header_text);
  std::__cxx11::string::~string((string *)&this->forced_pdf_version);
  std::__cxx11::string::~string((string *)&this->min_pdf_version);
  std::__cxx11::string::~string((string *)&this->final_pdf_version);
  std::__cxx11::string::~string((string *)&this->id2);
  std::__cxx11::string::~string((string *)&this->id1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->encryption_dictionary);
  std::__cxx11::string::~string((string *)&this->encryption_key);
  return;
}

Assistant:

QPDFWriter::Members::~Members()
{
    if (file && close_file) {
        fclose(file);
    }
    delete output_buffer;
}